

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall fmt::ArgList::operator[](Arg *__return_storage_ptr__,ArgList *this,uint index)

{
  Type TVar1;
  Type TVar2;
  Value *pVVar3;
  Value *local_70;
  uint local_4c;
  uint i;
  Value *val;
  Type arg_type;
  bool use_values;
  Arg arg;
  uint index_local;
  ArgList *this_local;
  
  TVar1 = type(this,0xf);
  if (index < 0x10) {
    TVar2 = type(this,index);
    if (TVar2 != NONE) {
      if (TVar1 != NONE) {
        local_70 = (this->field_1).values_ + (ulong)index * 2;
      }
      else {
        local_70 = (this->field_1).values_ + index;
      }
      _arg_type = (local_70->field_0).long_long_value;
      arg.super_Value.field_0.long_long_value = (local_70->field_0).string.size;
    }
    (__return_storage_ptr__->super_Value).field_0.long_long_value = _arg_type;
    (__return_storage_ptr__->super_Value).field_0.string.size =
         arg.super_Value.field_0.long_long_value;
    *(ulong *)&__return_storage_ptr__->type =
         CONCAT44(arg.super_Value.field_0.string.size._4_4_,TVar2);
    *(Type *)&__return_storage_ptr__->field_0x18 = arg.type;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = arg._20_4_;
  }
  else if (TVar1 != NONE) {
    for (local_4c = 0x10; local_4c <= index; local_4c = local_4c + 1) {
      if ((this->field_1).values_[(ulong)local_4c * 2 + 1].field_0.int_value == 0) {
        pVVar3 = (this->field_1).values_ + (ulong)local_4c * 2;
        (__return_storage_ptr__->super_Value).field_0.long_long_value =
             (pVVar3->field_0).long_long_value;
        (__return_storage_ptr__->super_Value).field_0.string.size = (pVVar3->field_0).string.size;
        *(LongLong *)&__return_storage_ptr__->type = pVVar3[1].field_0.long_long_value;
        *(size_t *)&__return_storage_ptr__->field_0x18 = pVVar3[1].field_0.string.size;
        return __return_storage_ptr__;
      }
    }
    pVVar3 = (this->field_1).values_ + (ulong)index * 2;
    (__return_storage_ptr__->super_Value).field_0.long_long_value =
         (pVVar3->field_0).long_long_value;
    (__return_storage_ptr__->super_Value).field_0.string.size = (pVVar3->field_0).string.size;
    *(LongLong *)&__return_storage_ptr__->type = pVVar3[1].field_0.long_long_value;
    *(size_t *)&__return_storage_ptr__->field_0x18 = pVVar3[1].field_0.string.size;
  }
  else {
    (__return_storage_ptr__->super_Value).field_0.long_long_value = _arg_type;
    (__return_storage_ptr__->super_Value).field_0.string.size =
         arg.super_Value.field_0.long_long_value;
    *(ulong *)&__return_storage_ptr__->type =
         (ulong)(uint)arg.super_Value.field_0.string.size._4_4_ << 0x20;
    *(Type *)&__return_storage_ptr__->field_0x18 = arg.type;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = arg._20_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

internal::Arg operator[](unsigned index) const {
    using internal::Arg;
    Arg arg;
    bool use_values = type(MAX_PACKED_ARGS - 1) == Arg::NONE;
    if (index < MAX_PACKED_ARGS) {
      Arg::Type arg_type = type(index);
      internal::Value &val = arg;
      if (arg_type != Arg::NONE)
        val = use_values ? values_[index] : args_[index];
      arg.type = arg_type;
      return arg;
    }
    if (use_values) {
      // The index is greater than the number of arguments that can be stored
      // in values, so return a "none" argument.
      arg.type = Arg::NONE;
      return arg;
    }
    for (unsigned i = MAX_PACKED_ARGS; i <= index; ++i) {
      if (args_[i].type == Arg::NONE)
        return args_[i];
    }
    return args_[index];
  }